

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

void __thiscall
btAlignedObjectArray<btBroadphasePair>::quickSortInternal<btBroadphasePairSortPredicate>
          (btAlignedObjectArray<btBroadphasePair> *this,btBroadphasePairSortPredicate *CompareFunc,
          int lo,int hi)

{
  bool bVar1;
  int in_ECX;
  int in_EDX;
  btAlignedObjectArray<btBroadphasePair> *in_RSI;
  long in_RDI;
  btBroadphasePair x;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar2;
  int iVar3;
  
  iVar2 = in_ECX;
  iVar3 = in_EDX;
  btBroadphasePair::btBroadphasePair
            ((btBroadphasePair *)&stack0xffffffffffffffc0,
             (btBroadphasePair *)(*(long *)(in_RDI + 0x10) + (long)((in_EDX + in_ECX) / 2) * 0x20));
  do {
    while (bVar1 = btBroadphasePairSortPredicate::operator()
                             ((btBroadphasePairSortPredicate *)in_RSI,
                              (btBroadphasePair *)(*(long *)(in_RDI + 0x10) + (long)in_EDX * 0x20),
                              (btBroadphasePair *)&stack0xffffffffffffffc0), bVar1) {
      in_EDX = in_EDX + 1;
    }
    while (bVar1 = btBroadphasePairSortPredicate::operator()
                             ((btBroadphasePairSortPredicate *)in_RSI,
                              (btBroadphasePair *)&stack0xffffffffffffffc0,
                              (btBroadphasePair *)(*(long *)(in_RDI + 0x10) + (long)in_ECX * 0x20)),
          bVar1) {
      in_ECX = in_ECX + -1;
    }
    if (in_EDX <= in_ECX) {
      swap((btAlignedObjectArray<btBroadphasePair> *)CONCAT44(in_EDX,in_ECX),
           in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
      in_EDX = in_EDX + 1;
      in_ECX = in_ECX + -1;
    }
  } while (in_EDX <= in_ECX);
  if (iVar3 < in_ECX) {
    quickSortInternal<btBroadphasePairSortPredicate>
              (in_RSI,(btBroadphasePairSortPredicate *)CONCAT44(iVar3,iVar2),in_EDX,in_ECX);
  }
  if (in_EDX < iVar2) {
    quickSortInternal<btBroadphasePairSortPredicate>
              (in_RSI,(btBroadphasePairSortPredicate *)CONCAT44(iVar3,iVar2),in_EDX,in_ECX);
  }
  return;
}

Assistant:

void quickSortInternal(const L& CompareFunc,int lo, int hi)
		{
		//  lo is the lower index, hi is the upper index
		//  of the region of array a that is to be sorted
			int i=lo, j=hi;
			T x=m_data[(lo+hi)/2];

			//  partition
			do
			{    
				while (CompareFunc(m_data[i],x)) 
					i++; 
				while (CompareFunc(x,m_data[j])) 
					j--;
				if (i<=j)
				{
					swap(i,j);
					i++; j--;
				}
			} while (i<=j);

			//  recursion
			if (lo<j) 
				quickSortInternal( CompareFunc, lo, j);
			if (i<hi) 
				quickSortInternal( CompareFunc, i, hi);
		}